

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::CloudMediumProvider::Density(CloudMediumProvider *this,Point3f p,SampledWavelengths *param_2)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  CloudMediumProvider *this_00;
  undefined1 auVar6 [16];
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  float fVar15;
  Point3f p_00;
  Point3f p_01;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  Vector3f VVar16;
  
  auVar9._8_56_ = p._8_56_;
  auVar9._0_8_ = p.super_Tuple3<pbrt::Point3,_float>._0_8_;
  fVar12 = this->frequency;
  fVar14 = fVar12 * p.super_Tuple3<pbrt::Point3,_float>.x;
  fVar15 = fVar12 * p.super_Tuple3<pbrt::Point3,_float>.y;
  fVar12 = fVar12 * p.super_Tuple3<pbrt::Point3,_float>.z;
  this_00 = this;
  if (0.0 < this->wispiness) {
    fVar7 = 10.0;
    bVar3 = true;
    fVar11 = this->wispiness * 0.05;
    do {
      bVar4 = bVar3;
      p_00.super_Tuple3<pbrt::Point3,_float>.x = fVar14 * fVar7;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = fVar15 * fVar7;
      p_00.super_Tuple3<pbrt::Point3,_float>.z = fVar12 * fVar7;
      VVar16 = DNoise(p_00);
      fVar14 = fVar14 + fVar11 * VVar16.super_Tuple3<pbrt::Vector3,_float>.x;
      fVar15 = fVar15 + fVar11 * VVar16.super_Tuple3<pbrt::Vector3,_float>.y;
      fVar7 = fVar7 * 1.99;
      fVar12 = fVar12 + fVar11 * VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
      bVar3 = false;
      fVar11 = fVar11 * 0.5;
    } while (bVar4);
  }
  fVar7 = 1.0;
  fVar11 = 0.5;
  iVar5 = 5;
  auVar6 = ZEXT816(0) << 0x40;
  do {
    p_01.super_Tuple3<pbrt::Point3,_float>.x = fVar14 * fVar7;
    p_01.super_Tuple3<pbrt::Point3,_float>.y = fVar15 * fVar7;
    p_01.super_Tuple3<pbrt::Point3,_float>.z = fVar12 * fVar7;
    auVar10._0_4_ = Noise((pbrt *)this_00,p_01);
    auVar10._4_60_ = extraout_var;
    iVar5 = iVar5 + -1;
    auVar6 = vfmadd231ss_fma(ZEXT416(auVar6._0_4_),ZEXT416((uint)fVar11),auVar10._0_16_);
    fVar11 = fVar11 * 0.5;
    fVar7 = fVar7 * 1.99;
  } while (iVar5 != 0);
  auVar8 = vmovshdup_avx(auVar9._0_16_);
  auVar13 = ZEXT816(0);
  auVar1 = vmaxss_avx(ZEXT416((uint)(0.5 - auVar8._0_4_)),auVar13);
  auVar8 = ZEXT416((uint)(auVar6._0_4_ * (1.0 - auVar8._0_4_) * 4.5 * this->density));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar8);
  uVar2 = vcmpss_avx512f(auVar8,auVar13,1);
  auVar6._0_4_ = (uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_;
  auVar1 = vfmadd231ss_fma(auVar6,auVar1,ZEXT416(0x40000000));
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar1);
  uVar2 = vcmpss_avx512f(auVar1,auVar13,1);
  iVar5 = (uint)!(bool)((byte)uVar2 & 1) * auVar6._0_4_;
  return (array<float,_4>)CONCAT88(CONCAT44((float)iVar5,(float)iVar5),CONCAT44(iVar5,iVar5));
}

Assistant:

Density(Point3f p, const SampledWavelengths &) const {
        Point3f pp = frequency * p;
        if (wispiness > 0) {
            // Perturb cloud lookup point _pp_ using noise
            Float vomega = .05f * wispiness, vlambda = 10.f;
            for (int i = 0; i < 2; ++i) {
                pp += vomega * DNoise(vlambda * pp);
                vomega *= 0.5f;
                vlambda *= 1.99f;
            }
        }
        // Sum scales of noise to approximate cloud density
        Float d = 0;
        Float omega = .5, lambda = 1.f;
        for (int i = 0; i < 5; ++i) {
            d += omega * Noise(lambda * pp);
            omega *= 0.5f;
            lambda *= 1.99f;
        }

        // Model decrease in density with altitude and return final cloud density
        d = Clamp((1 - p.y) * 4.5f * density * d, 0, 1);
        d += 2 * std::max<Float>(0, .5f - p.y);
        return SampledSpectrum(Clamp(d, 0, 1));
    }